

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineparser.cpp
# Opt level: O0

QCommandLineOption __thiscall QCommandLineParser::addHelpOption(QCommandLineParser *this)

{
  QList<QString> *valueName;
  QList<QString> *description;
  QCommandLineOption *in_RSI;
  QSharedDataPointer<QCommandLineOptionPrivate> in_RDI;
  long in_FS_OFFSET;
  QCommandLineOption *opt;
  char16_t *str;
  char16_t *str_1;
  char16_t *str_2;
  QCommandLineOption optHelpAll;
  undefined4 in_stack_fffffffffffffe28;
  int in_stack_fffffffffffffe2c;
  QCommandLineOptionPrivate *names;
  QCommandLineOptionPrivate *option;
  QCommandLineParser *this_00;
  QArrayDataPointer<char16_t> local_100 [2];
  undefined1 *local_d0;
  QArrayDataPointer<char16_t> local_80 [2];
  QArrayDataPointer<char16_t> local_50 [2];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined1 **)in_RDI.d.ptr = &DAT_aaaaaaaaaaaaaaaa;
  names = (QCommandLineOptionPrivate *)in_RDI.d.ptr;
  option = (QCommandLineOptionPrivate *)in_RDI.d.ptr;
  memset(local_20,0,0x18);
  QList<QString>::QList((QList<QString> *)0x1f9b6d);
  this_00 = (QCommandLineParser *)0x2211c0;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_50,(Data *)0x0,L"h",1);
  QString::QString((QString *)in_RDI.d.ptr,
                   (DataPointer *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  valueName = QList<QString>::operator<<
                        ((QList<QString> *)in_RDI.d.ptr,
                         (rvalue_ref)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_80,(Data *)0x0,L"help",4);
  QString::QString((QString *)in_RDI.d.ptr,
                   (DataPointer *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  description = QList<QString>::operator<<
                          ((QList<QString> *)in_RDI.d.ptr,
                           (rvalue_ref)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28)
                          );
  tr((char *)valueName,(char *)in_RDI.d.ptr,in_stack_fffffffffffffe2c);
  QString::QString((QString *)0x1f9c6e);
  QString::QString((QString *)0x1f9c7b);
  QCommandLineOption::QCommandLineOption
            (in_RSI,(QStringList *)names,(QString *)description,(QString *)valueName,
             (QString *)in_RDI.d.ptr);
  QString::~QString((QString *)0x1f9caf);
  QString::~QString((QString *)0x1f9cbc);
  QString::~QString((QString *)0x1f9cc9);
  QString::~QString((QString *)0x1f9cd6);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)in_RDI.d.ptr);
  QString::~QString((QString *)0x1f9cf0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)in_RDI.d.ptr);
  QList<QString>::~QList((QList<QString> *)0x1f9d0a);
  addOption(this_00,(QCommandLineOption *)option);
  local_d0 = &DAT_aaaaaaaaaaaaaaaa;
  QArrayDataPointer<char16_t>::QArrayDataPointer(local_100,(Data *)0x0,L"help-all",8);
  QString::QString((QString *)in_RDI.d.ptr,
                   (DataPointer *)CONCAT44(in_stack_fffffffffffffe2c,in_stack_fffffffffffffe28));
  tr((char *)valueName,(char *)in_RDI.d.ptr,in_stack_fffffffffffffe2c);
  QString::QString((QString *)0x1f9dae);
  QString::QString((QString *)0x1f9dbb);
  QCommandLineOption::QCommandLineOption
            (in_RSI,(QString *)names,(QString *)description,(QString *)valueName,
             (QString *)in_RDI.d.ptr);
  QString::~QString((QString *)0x1f9df5);
  QString::~QString((QString *)0x1f9e02);
  QString::~QString((QString *)0x1f9e0f);
  QString::~QString((QString *)0x1f9e1c);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)in_RDI.d.ptr);
  addOption(this_00,(QCommandLineOption *)option);
  *(undefined1 *)((long)&(in_RSI->d).d.ptr[1].defaultValues.d.d + 1) = 1;
  QCommandLineOption::~QCommandLineOption((QCommandLineOption *)0x1f9e5c);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (QSharedDataPointer<QCommandLineOptionPrivate>)
         (QSharedDataPointer<QCommandLineOptionPrivate>)in_RDI.d.ptr;
}

Assistant:

QCommandLineOption QCommandLineParser::addHelpOption()
{
    QCommandLineOption opt(QStringList()
#ifdef Q_OS_WIN
                << QStringLiteral("?")
#endif
                << QStringLiteral("h")
                << QStringLiteral("help"), tr("Displays help on commandline options."));
    addOption(opt);
    QCommandLineOption optHelpAll(QStringLiteral("help-all"),
                                  tr("Displays help, including generic Qt options."));
    addOption(optHelpAll);
    d->builtinHelpOption = true;
    return opt;
}